

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataRefs.cpp
# Opt level: O3

positionTy * DataRefs::GetViewPos(void)

{
  pthread_t pVar1;
  long lVar2;
  positionTy *ppVar3;
  positionTy *in_RDI;
  positionTy *ppVar4;
  byte bVar5;
  unique_lock<std::recursive_mutex> lock;
  unique_lock<std::recursive_mutex> local_20;
  
  bVar5 = 0;
  pVar1 = pthread_self();
  if (pVar1 == dataRefs.xpThread._M_thread) {
    ppVar3 = &lastCamPos;
    ppVar4 = in_RDI;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)((long)ppVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
  }
  else {
    local_20._M_device = &mutexDrUpdate;
    local_20._M_owns = false;
    std::unique_lock<std::recursive_mutex>::lock(&local_20);
    local_20._M_owns = true;
    ppVar3 = &lastCamPos;
    ppVar4 = in_RDI;
    for (lVar2 = 9; lVar2 != 0; lVar2 = lVar2 + -1) {
      ppVar4->_lat = ppVar3->_lat;
      ppVar3 = (positionTy *)((long)ppVar3 + ((ulong)bVar5 * -2 + 1) * 8);
      ppVar4 = (positionTy *)((long)ppVar4 + (ulong)bVar5 * -0x10 + 8);
    }
    std::unique_lock<std::recursive_mutex>::unlock(&local_20);
    std::unique_lock<std::recursive_mutex>::~unique_lock(&local_20);
  }
  return in_RDI;
}

Assistant:

positionTy DataRefs::GetViewPos()
{
    // If in main thread just return latest pos
    if (dataRefs.IsXPThread())
        return lastCamPos;
    else
    {
        // calling from another thread: safely copy the cached value
        std::unique_lock<std::recursive_mutex> lock(mutexDrUpdate);
        positionTy camPos = lastCamPos;
        lock.unlock();
        return camPos;
    }
}